

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ElemSegmentModuleField::~ElemSegmentModuleField(ElemSegmentModuleField *this)

{
  ~ElemSegmentModuleField(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

explicit ElemSegmentModuleField(const Location& loc = Location(),
                                  std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::ElemSegment>(loc),
        elem_segment(name) {}